

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::draw_elements_instanced(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  bool bVar1;
  ContextType ctxType;
  mapped_type *pmVar2;
  GLfloat vertices [1];
  GLuint buf;
  GLuint tfID;
  GLuint fbo;
  allocator<char> local_2a2;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  StringTemplate local_260;
  string local_240;
  string local_220;
  StringTemplate local_200;
  char *tfVarying;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram program;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  fbo = 0;
  buf = 0;
  tfID = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"GLSL_VERSION_STRING",(allocator<char> *)&tfVarying);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&program);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&program);
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,
             "${GLSL_VERSION_STRING}\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             &local_2a1);
  tcu::StringTemplate::StringTemplate(&local_200,&local_220);
  tcu::StringTemplate::specialize(&local_2a0,&local_200,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,
             "${GLSL_VERSION_STRING}\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,&local_2a2);
  tcu::StringTemplate::StringTemplate(&local_260,&local_280);
  tcu::StringTemplate::specialize(&local_240,&local_260,&args);
  glu::makeVtxFragSources((ProgramSources *)&tfVarying,&local_2a0,&local_240);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&tfVarying);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&tfVarying);
  std::__cxx11::string::~string((string *)&local_240);
  tcu::StringTemplate::~StringTemplate(&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  tcu::StringTemplate::~StringTemplate(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  glu::CallLogWrapper::glVertexAttribDivisor(&ctx->super_CallLogWrapper,0,1);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tfVarying,"GL_INVALID_ENUM is generated if mode is not an accepted value.",
             (allocator<char> *)&local_2a0);
  NegativeTestContext::beginSection(ctx,(string *)&tfVarying);
  std::__cxx11::string::~string((string *)&tfVarying);
  glu::CallLogWrapper::glDrawElementsInstanced
            (&ctx->super_CallLogWrapper,0xffffffff,1,0x1401,vertices,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tfVarying,
             "GL_INVALID_ENUM is generated if type is not one of the accepted values.",
             (allocator<char> *)&local_2a0);
  NegativeTestContext::beginSection(ctx,(string *)&tfVarying);
  std::__cxx11::string::~string((string *)&tfVarying);
  glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,1,0xffffffff,vertices,1)
  ;
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,1,0x1406,vertices,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tfVarying,
             "GL_INVALID_VALUE is generated if count or primcount are negative.",
             (allocator<char> *)&local_2a0);
  NegativeTestContext::beginSection(ctx,(string *)&tfVarying);
  std::__cxx11::string::~string((string *)&tfVarying);
  glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,-1,0x1401,vertices,1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,0xb,0x1401,vertices,-1);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tfVarying,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,(allocator<char> *)&local_2a0);
  NegativeTestContext::beginSection(ctx,(string *)&tfVarying);
  std::__cxx11::string::~string((string *)&tfVarying);
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
  glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
  glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,1,0x1401,vertices,1);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  NegativeTestContext::endSection(ctx);
  bVar1 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_EXT_geometry_shader");
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tfVarying,
               "GL_INVALID_OPERATION is generated if transform feedback is active and not paused.",
               (allocator<char> *)&local_2a0);
    NegativeTestContext::beginSection(ctx,(string *)&tfVarying);
    std::__cxx11::string::~string((string *)&tfVarying);
    tfVarying = "gl_Position";
    glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&buf);
    glu::CallLogWrapper::glGenTransformFeedbacks(&ctx->super_CallLogWrapper,1,&tfID);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
    glu::CallLogWrapper::glTransformFeedbackVaryings
              (&ctx->super_CallLogWrapper,program.m_program.m_program,1,&tfVarying,0x8c8c);
    glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
    glu::CallLogWrapper::glBindTransformFeedback(&ctx->super_CallLogWrapper,0x8e22,tfID);
    glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8c8e,buf);
    glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8c8e,0x20,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBufferBase(&ctx->super_CallLogWrapper,0x8c8e,0,buf);
    glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,0);
    NegativeTestContext::expectError(ctx,0);
    glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,1,0x1401,vertices,1);
    NegativeTestContext::expectError(ctx,0x502);
    glu::CallLogWrapper::glPauseTransformFeedback(&ctx->super_CallLogWrapper);
    glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,1,0x1401,vertices,1);
    NegativeTestContext::expectError(ctx,0);
    glu::CallLogWrapper::glEndTransformFeedback(&ctx->super_CallLogWrapper);
    glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&buf);
    glu::CallLogWrapper::glDeleteTransformFeedbacks(&ctx->super_CallLogWrapper,1,&tfID);
    NegativeTestContext::expectError(ctx,0);
    NegativeTestContext::endSection(ctx);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&args._M_t);
  return;
}

Assistant:

void draw_elements_instanced (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	GLuint						fbo		= 0;
	GLuint						buf		= 0;
	GLuint						tfID	= 0;
	GLfloat						vertices[1];
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	glu::ShaderProgram			program	(ctx.getRenderContext(), glu::makeVtxFragSources(tcu::StringTemplate(vertexShaderSource).specialize(args), tcu::StringTemplate(fragmentShaderSource).specialize(args)));

	ctx.glUseProgram(program.getProgram());
	ctx.glVertexAttribDivisor(0, 1);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawElementsInstanced(-1, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not one of the accepted values.");
	ctx.glDrawElementsInstanced(GL_POINTS, 1, -1, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glDrawElementsInstanced(GL_POINTS, 1, GL_FLOAT, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count or primcount are negative.");
	ctx.glDrawElementsInstanced(GL_POINTS, -1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDrawElementsInstanced(GL_POINTS, 11, GL_UNSIGNED_BYTE, vertices, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawElementsInstanced(GL_POINTS, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();

	if (!ctx.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader")) // GL_EXT_geometry_shader removes error
	{
		ctx.beginSection("GL_INVALID_OPERATION is generated if transform feedback is active and not paused.");
		const char* tfVarying = "gl_Position";

		ctx.glGenBuffers(1, &buf);
		ctx.glGenTransformFeedbacks(1, &tfID);

		ctx.glUseProgram(program.getProgram());
		ctx.glTransformFeedbackVaryings(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
		ctx.glLinkProgram(program.getProgram());
		ctx.glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tfID);
		ctx.glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buf);
		ctx.glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
		ctx.glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
		ctx.glBeginTransformFeedback(GL_POINTS);
		ctx.expectError(GL_NO_ERROR);

		ctx.glDrawElementsInstanced(GL_POINTS, 1, GL_UNSIGNED_BYTE, vertices, 1);
		ctx.expectError(GL_INVALID_OPERATION);

		ctx.glPauseTransformFeedback();
		ctx.glDrawElementsInstanced(GL_POINTS, 1, GL_UNSIGNED_BYTE, vertices, 1);
		ctx.expectError(GL_NO_ERROR);

		ctx.glEndTransformFeedback();
		ctx.glDeleteBuffers(1, &buf);
		ctx.glDeleteTransformFeedbacks(1, &tfID);
		ctx.expectError(GL_NO_ERROR);
		ctx.endSection();
	}

	ctx.glUseProgram(0);
}